

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_config.cc
# Opt level: O3

bool CheckPeerVerifyPrefs(SSL *ssl)

{
  int idx;
  void *pvVar1;
  size_t sVar2;
  size_t sVar3;
  bool bVar4;
  uint16_t *peer_sigalgs;
  uint16_t *local_20;
  
  idx = TestConfigExDataIndex();
  pvVar1 = SSL_get_ex_data((SSL *)ssl,idx);
  bVar4 = true;
  if (*(long *)((long)pvVar1 + 0x70) != *(long *)((long)pvVar1 + 0x78)) {
    sVar2 = SSL_get0_peer_verify_algorithms(ssl,&local_20);
    if (*(long *)((long)pvVar1 + 0x78) - *(long *)((long)pvVar1 + 0x70) >> 1 == sVar2) {
      if (sVar2 != 0) {
        sVar3 = 0;
        do {
          if (local_20[sVar3] != *(uint16_t *)(*(long *)((long)pvVar1 + 0x70) + sVar3 * 2)) {
            fprintf(_stderr,"peer verify preference %zu mismatch (got %04x, wanted %04x\n");
            return false;
          }
          sVar3 = sVar3 + 1;
        } while (sVar2 != sVar3);
      }
    }
    else {
      bVar4 = false;
      fprintf(_stderr,"peer verify preferences length mismatch (got %zu, wanted %zu)\n",sVar2);
    }
  }
  return bVar4;
}

Assistant:

static bool CheckPeerVerifyPrefs(SSL *ssl) {
  const TestConfig *config = GetTestConfig(ssl);
  if (!config->expect_peer_verify_prefs.empty()) {
    const uint16_t *peer_sigalgs;
    size_t num_peer_sigalgs =
        SSL_get0_peer_verify_algorithms(ssl, &peer_sigalgs);
    if (config->expect_peer_verify_prefs.size() != num_peer_sigalgs) {
      fprintf(stderr,
              "peer verify preferences length mismatch (got %zu, wanted %zu)\n",
              num_peer_sigalgs, config->expect_peer_verify_prefs.size());
      return false;
    }
    for (size_t i = 0; i < num_peer_sigalgs; i++) {
      if (peer_sigalgs[i] != config->expect_peer_verify_prefs[i]) {
        fprintf(stderr,
                "peer verify preference %zu mismatch (got %04x, wanted %04x\n",
                i, peer_sigalgs[i], config->expect_peer_verify_prefs[i]);
        return false;
      }
    }
  }
  return true;
}